

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_init(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EVP_PKEY *pkey)

{
  size_t sVar1;
  ptls_key_exchange_context_t **local_58;
  undefined8 local_50;
  undefined8 local_48;
  code *local_40;
  st_evp_keyex_context_t *local_38;
  int local_2c;
  st_evp_keyex_context_t *psStack_28;
  int ret;
  st_evp_keyex_context_t *ctx;
  EVP_PKEY *pkey_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  psStack_28 = (st_evp_keyex_context_t *)0x0;
  ctx = (st_evp_keyex_context_t *)pkey;
  pkey_local = (EVP_PKEY *)_ctx;
  _ctx_local = (ptls_key_exchange_context_t **)algo;
  psStack_28 = (st_evp_keyex_context_t *)malloc(0x28);
  if (psStack_28 == (st_evp_keyex_context_t *)0x0) {
    local_2c = 0x201;
  }
  else {
    local_58 = _ctx_local;
    local_50 = 0;
    local_48 = 0;
    local_40 = evp_keyex_on_exchange;
    local_38 = ctx;
    memcpy(psStack_28,&local_58,0x28);
    sVar1 = EVP_PKEY_get1_encoded_public_key(psStack_28->privkey,&(psStack_28->super).pubkey);
    (psStack_28->super).pubkey.len = sVar1;
    if (sVar1 == 0) {
      (psStack_28->super).pubkey.base = (uint8_t *)0x0;
      local_2c = 0x201;
    }
    else {
      *(st_evp_keyex_context_t **)pkey_local = psStack_28;
      local_2c = 0;
    }
  }
  if ((local_2c != 0) && (psStack_28 != (st_evp_keyex_context_t *)0x0)) {
    psStack_28->privkey = (EVP_PKEY *)0x0;
    evp_keyex_free(psStack_28);
  }
  return local_2c;
}

Assistant:

static int evp_keyex_init(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EVP_PKEY *pkey)
{
    struct st_evp_keyex_context_t *ctx = NULL;
    int ret;

    /* instantiate */
    if ((ctx = malloc(sizeof(*ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *ctx = (struct st_evp_keyex_context_t){{algo, {NULL}, evp_keyex_on_exchange}, pkey};

    /* set public key */
    if ((ctx->super.pubkey.len = EVP_PKEY_get1_tls_encodedpoint(ctx->privkey, &ctx->super.pubkey.base)) == 0) {
        ctx->super.pubkey.base = NULL;
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    *_ctx = &ctx->super;
    ret = 0;
Exit:
    if (ret != 0 && ctx != NULL) {
        ctx->privkey = NULL; /* do not decrement refcount of pkey in case of error */
        evp_keyex_free(ctx);
    }
    return ret;
}